

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

void __thiscall
de::FilePath::FilePath
          (FilePath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *components)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  char *pcVar4;
  const_reference pvVar5;
  ulong local_20;
  size_t ndx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  FilePath *this_local;
  
  std::__cxx11::string::string((string *)this);
  local_20 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(components);
    if (sVar2 <= local_20) break;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::size();
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
      bVar1 = isSeparator(*pcVar4);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)this,(string *)separator_abi_cxx11_);
      }
    }
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](components,local_20);
    std::__cxx11::string::operator+=((string *)this,(string *)pvVar5);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

FilePath::FilePath (const std::vector<std::string>& components)
{
	for (size_t ndx = 0; ndx < components.size(); ndx++)
	{
		if (!m_path.empty() && !isSeparator(m_path[m_path.size()-1]))
			m_path += separator;
		m_path += components[ndx];
	}
}